

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O0

Status * __thiscall
draco::PointCloudDecoder::DecodeStep1
          (PointCloudDecoder *this,DecoderOptions *options,DecoderBuffer *in_buffer,
          PointCloud *out_point_cloud)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  DecoderBuffer *in_RCX;
  DecoderOptions *in_RDX;
  PointCloudDecoder *in_RSI;
  DecoderBuffer *in_RDI;
  PointCloud *in_R8;
  uint8_t max_supported_minor_version;
  uint8_t max_supported_major_version;
  DracoHeader header;
  Status *_local_status;
  undefined8 in_stack_fffffffffffffe68;
  Code CVar5;
  Status *in_stack_fffffffffffffe70;
  Status *this_00;
  byte local_163;
  allocator<char> *in_stack_fffffffffffffea0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffea8;
  DecoderBuffer *this_01;
  allocator<char> local_131;
  string local_130 [39];
  allocator<char> local_109;
  PointCloudDecoder *in_stack_fffffffffffffef8;
  allocator<char> local_e1;
  string local_e0 [38];
  byte local_ba;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [37];
  byte local_6b;
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68 [32];
  uint local_48;
  byte local_35;
  uint8_t local_2f;
  uint8_t local_2e;
  byte local_2d;
  ushort local_2a;
  
  CVar5 = (Code)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  in_RSI->options_ = in_RDX;
  in_RSI->buffer_ = in_RCX;
  in_RSI->point_cloud_ = in_R8;
  local_35 = 0;
  this_01 = in_RDI;
  DecodeHeader(in_RDI,(DracoHeader *)in_RSI);
  bVar1 = Status::ok((Status *)in_RDI);
  if (!bVar1) {
    local_35 = 1;
  }
  local_48 = (uint)!bVar1;
  if ((local_35 & 1) == 0) {
    Status::~Status((Status *)0x1ad937);
  }
  if (local_48 == 0) {
    uVar3 = (uint)local_2d;
    uVar4 = (*in_RSI->_vptr_PointCloudDecoder[2])();
    if (uVar3 == uVar4) {
      in_RSI->version_major_ = local_2f;
      in_RSI->version_minor_ = local_2e;
      local_6a = 2;
      local_163 = 3;
      if (local_2d != 0) {
        local_163 = 2;
      }
      local_6b = local_163;
      if ((in_RSI->version_major_ == '\0') || (2 < in_RSI->version_major_)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (char *)CONCAT44(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
        Status::Status(in_stack_fffffffffffffe70,CVar5,(string *)0x1adaf6);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      else if ((in_RSI->version_major_ == '\x02') && (local_163 < in_RSI->version_minor_)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                   (char *)CONCAT44(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
        Status::Status(in_stack_fffffffffffffe70,CVar5,(string *)0x1adbd6);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
      }
      else {
        DecoderBuffer::set_bitstream_version
                  (in_RSI->buffer_,CONCAT11(in_RSI->version_major_,in_RSI->version_minor_));
        uVar2 = bitstream_version(in_RSI);
        if ((0x102 < uVar2) && ((local_2a & 0x8000) != 0)) {
          local_ba = 0;
          DecodeMetadata(in_stack_fffffffffffffef8);
          bVar1 = Status::ok((Status *)in_RDI);
          if (!bVar1) {
            local_ba = 1;
          }
          local_48 = (uint)!bVar1;
          if ((local_ba & 1) == 0) {
            Status::~Status((Status *)0x1add17);
          }
          if (local_48 != 0) {
            return (Status *)this_01;
          }
        }
        uVar4 = (*in_RSI->_vptr_PointCloudDecoder[3])();
        if ((uVar4 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                     (char *)CONCAT44(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
          Status::Status(in_stack_fffffffffffffe70,CVar5,(string *)0x1add82);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
        }
        else {
          uVar4 = (*in_RSI->_vptr_PointCloudDecoder[5])();
          if ((uVar4 & 1) == 0) {
            this_00 = (Status *)&local_109;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                       (char *)CONCAT44(uVar3,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0);
            Status::Status(this_00,CVar5,(string *)0x1ade43);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
            std::allocator<char>::~allocator(&local_109);
          }
          else {
            uVar4 = (*in_RSI->_vptr_PointCloudDecoder[6])();
            if ((uVar4 & 1) == 0) {
              CVar5 = (Code)((ulong)&local_131 >> 0x20);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_01,(char *)CONCAT44(uVar3,in_stack_fffffffffffffea8),
                         in_stack_fffffffffffffea0);
              Status::Status(in_stack_fffffffffffffe70,CVar5,(string *)0x1adef9);
              std::__cxx11::string::~string(local_130);
              std::allocator<char>::~allocator(&local_131);
            }
            else {
              OkStatus();
            }
          }
        }
      }
    }
    else {
      __a = &local_69;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (char *)CONCAT44(uVar3,in_stack_fffffffffffffea8),__a);
      Status::Status(in_stack_fffffffffffffe70,CVar5,(string *)0x1ad9b2);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator(&local_69);
    }
  }
  return (Status *)this_01;
}

Assistant:

Status PointCloudDecoder::DecodeStep1(const DecoderOptions &options,
                                 DecoderBuffer *in_buffer,
                                 PointCloud *out_point_cloud) {
  options_ = &options;
  buffer_ = in_buffer;
  point_cloud_ = out_point_cloud;
  DracoHeader header;
  DRACO_RETURN_IF_ERROR(DecodeHeader(buffer_, &header))
  // Sanity check that we are really using the right decoder (mostly for cases
  // where the Decode method was called manually outside of our main API.
  if (header.encoder_type != GetGeometryType()) {
    return Status(Status::DRACO_ERROR,
                  "Using incompatible decoder for the input geometry.");
  }
  // TODO(ostava): We should check the method as well, but currently decoders
  // don't expose the decoding method id.
  version_major_ = header.version_major;
  version_minor_ = header.version_minor;

  const uint8_t max_supported_major_version =
      header.encoder_type == POINT_CLOUD ? kDracoPointCloudBitstreamVersionMajor
                                         : kDracoMeshBitstreamVersionMajor;
  const uint8_t max_supported_minor_version =
      header.encoder_type == POINT_CLOUD ? kDracoPointCloudBitstreamVersionMinor
                                         : kDracoMeshBitstreamVersionMinor;

  // Check for version compatibility.
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (version_major_ < 1 || version_major_ > max_supported_major_version) {
    return Status(Status::UNKNOWN_VERSION, "Unknown major version.");
  }
  if (version_major_ == max_supported_major_version &&
      version_minor_ > max_supported_minor_version) {
    return Status(Status::UNKNOWN_VERSION, "Unknown minor version.");
  }
#else
  if (version_major_ != max_supported_major_version) {
    return Status(Status::UNKNOWN_VERSION, "Unsupported major version.");
  }
  if (version_minor_ != max_supported_minor_version) {
    return Status(Status::UNKNOWN_VERSION, "Unsupported minor version.");
  }
#endif
  buffer_->set_bitstream_version(
      DRACO_BITSTREAM_VERSION(version_major_, version_minor_));

  if (bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 3) &&
      (header.flags & METADATA_FLAG_MASK)) {
    DRACO_RETURN_IF_ERROR(DecodeMetadata())
  }
  if (!InitializeDecoder()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize the decoder.");
  }
  if (!DecodeGeometryData()) {
    return Status(Status::DRACO_ERROR, "Failed to decode geometry data.");
  }
  if (!DecodePointAttributesStep1()) {
    return Status(Status::DRACO_ERROR, "Failed to decode point attributes.");
  }
  return OkStatus();
}